

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::BorderAmounts_EdgeSizes::SerializeWithCachedSizes
          (BorderAmounts_EdgeSizes *this,CodedOutputStream *output)

{
  if (this->startedgesize_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,this->startedgesize_,output);
  }
  if (this->endedgesize_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,this->endedgesize_,output);
    return;
  }
  return;
}

Assistant:

void BorderAmounts_EdgeSizes::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.BorderAmounts.EdgeSizes)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 startEdgeSize = 1;
  if (this->startedgesize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->startedgesize(), output);
  }

  // uint64 endEdgeSize = 2;
  if (this->endedgesize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->endedgesize(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.BorderAmounts.EdgeSizes)
}